

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomon.cpp
# Opt level: O0

void __thiscall iomon::iomon(iomon *this)

{
  initializer_list<prmon::parameter> __l;
  bool bVar1;
  Imonitor *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>,_bool>
  pVar2;
  parameter *param;
  const_iterator __end1;
  const_iterator __begin1;
  parameter_list *__range1;
  parameter *in_stack_fffffffffffffa08;
  undefined7 in_stack_fffffffffffffa10;
  undefined1 in_stack_fffffffffffffa17;
  parameter *in_stack_fffffffffffffa18;
  monitored_value *in_stack_fffffffffffffa20;
  parameter *in_stack_fffffffffffffa28;
  undefined7 in_stack_fffffffffffffa30;
  undefined1 in_stack_fffffffffffffa37;
  string *in_stack_fffffffffffffa38;
  string *in_stack_fffffffffffffa40;
  iterator in_stack_fffffffffffffa48;
  parameter *in_stack_fffffffffffffa50;
  undefined8 **local_590;
  level_enum *in_stack_fffffffffffffb40;
  string *in_stack_fffffffffffffb48;
  MessageBase *in_stack_fffffffffffffb50;
  string local_3f8 [32];
  reference local_3d8;
  parameter *local_3d0;
  __normal_iterator<const_prmon::parameter_*,_std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>_>
  local_3c8;
  Imonitor *local_3c0;
  allocator local_3b1;
  string local_3b0 [38];
  undefined1 local_38a;
  allocator local_389;
  string local_388 [39];
  allocator local_361;
  string local_360 [39];
  allocator local_339;
  string local_338 [39];
  allocator local_311;
  string local_310 [39];
  allocator local_2e9;
  string local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [39];
  allocator local_299;
  string local_298 [39];
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [55];
  allocator local_1c1;
  string local_1c0 [32];
  undefined1 **local_1a0;
  undefined8 *local_198 [12];
  undefined1 local_138 [96];
  undefined1 local_d8 [96];
  undefined1 local_78 [96];
  undefined1 **local_18;
  undefined8 local_10;
  
  Imonitor::Imonitor(in_RDI);
  MessageBase::MessageBase((MessageBase *)0x325255);
  in_RDI->_vptr_Imonitor = (_func_int **)&PTR__iomon_003c31f0;
  local_38a = 1;
  local_1a0 = (undefined1 **)local_198;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c0,"rchar",&local_1c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"B",&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"B/s",&local_221);
  prmon::parameter::parameter
            (in_stack_fffffffffffffa50,&in_stack_fffffffffffffa48->m_name,in_stack_fffffffffffffa40,
             in_stack_fffffffffffffa38);
  local_1a0 = (undefined1 **)local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"wchar",&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"B",&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_298,"B/s",&local_299);
  prmon::parameter::parameter
            (in_stack_fffffffffffffa50,&in_stack_fffffffffffffa48->m_name,in_stack_fffffffffffffa40,
             in_stack_fffffffffffffa38);
  local_1a0 = (undefined1 **)local_d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c0,"read_bytes",&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e8,"B",&local_2e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_310,"B/s",&local_311);
  prmon::parameter::parameter
            (in_stack_fffffffffffffa50,&in_stack_fffffffffffffa48->m_name,in_stack_fffffffffffffa40,
             in_stack_fffffffffffffa38);
  local_1a0 = (undefined1 **)local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_338,"write_bytes",&local_339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_360,"B",&local_361);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_388,"B/s",&local_389);
  prmon::parameter::parameter
            (in_stack_fffffffffffffa50,&in_stack_fffffffffffffa48->m_name,in_stack_fffffffffffffa40,
             in_stack_fffffffffffffa38);
  local_38a = 0;
  local_18 = (undefined1 **)local_198;
  local_10 = 4;
  std::allocator<prmon::parameter>::allocator((allocator<prmon::parameter> *)0x325603);
  __l._M_len = (size_type)in_stack_fffffffffffffa50;
  __l._M_array = in_stack_fffffffffffffa48;
  std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>::vector
            ((vector<prmon::parameter,_std::allocator<prmon::parameter>_> *)
             in_stack_fffffffffffffa40,__l,(allocator_type *)in_stack_fffffffffffffa38);
  std::allocator<prmon::parameter>::~allocator((allocator<prmon::parameter> *)0x325634);
  local_590 = &local_18;
  do {
    local_590 = local_590 + -0xc;
    prmon::parameter::~parameter
              ((parameter *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10));
  } while (local_590 != local_198);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator((allocator<char> *)&local_361);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  std::__cxx11::string::~string(local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  in_RDI[0xb]._vptr_Imonitor = (_func_int **)0x0;
  in_RDI[0xc]._vptr_Imonitor = (_func_int **)0x0;
  in_RDI[9]._vptr_Imonitor = (_func_int **)0x0;
  in_RDI[10]._vptr_Imonitor = (_func_int **)0x0;
  in_RDI[7]._vptr_Imonitor = (_func_int **)0x0;
  in_RDI[8]._vptr_Imonitor = (_func_int **)0x0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>_>
         *)0x3257d3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b0,"iomon",&local_3b1);
  MessageBase::log_init
            (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  local_3c0 = in_RDI + 4;
  local_3c8._M_current =
       (parameter *)
       std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>::begin
                 (in_stack_fffffffffffffa08);
  local_3d0 = (parameter *)
              std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>::end
                        ((vector<prmon::parameter,_std::allocator<prmon::parameter>_> *)
                         in_stack_fffffffffffffa08);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_prmon::parameter_*,_std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>_>
                        *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10),
                       (__normal_iterator<const_prmon::parameter_*,_std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>_>
                        *)in_stack_fffffffffffffa08);
    if (!bVar1) break;
    local_3d8 = __gnu_cxx::
                __normal_iterator<const_prmon::parameter_*,_std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>_>
                ::operator*(&local_3c8);
    prmon::parameter::get_name_abi_cxx11_(in_stack_fffffffffffffa08);
    prmon::parameter::parameter
              ((parameter *)CONCAT17(in_stack_fffffffffffffa37,in_stack_fffffffffffffa30),
               in_stack_fffffffffffffa28);
    prmon::monitored_value::monitored_value
              (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,(bool)in_stack_fffffffffffffa17,
               (mon_value)in_stack_fffffffffffffa08);
    pVar2 = std::
            map<std::__cxx11::string,prmon::monitored_value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,prmon::monitored_value>>>
            ::emplace<std::__cxx11::string_const,prmon::monitored_value>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_prmon::monitored_value>_>_>
                        *)in_stack_fffffffffffffa20,&in_stack_fffffffffffffa18->m_name,
                       (monitored_value *)
                       CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10));
    in_stack_fffffffffffffa37 = pVar2.second;
    prmon::monitored_value::~monitored_value((monitored_value *)0x325963);
    prmon::parameter::~parameter
              ((parameter *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10));
    std::__cxx11::string::~string(local_3f8);
    __gnu_cxx::
    __normal_iterator<const_prmon::parameter_*,_std::vector<prmon::parameter,_std::allocator<prmon::parameter>_>_>
    ::operator++(&local_3c8);
  }
  return;
}

Assistant:

iomon::iomon() : io_stats{} {
  log_init(MONITOR_NAME);
#undef MONITOR_NAME
  for (const auto& param : params) {
    io_stats.emplace(param.get_name(), prmon::monitored_value(param, true));
  }
}